

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_randomspawner.cpp
# Opt level: O2

void __thiscall ARandomSpawner::Tick(ARandomSpawner *this)

{
  TObjPtr<AActor> *obj;
  AActor *pAVar1;
  
  AActor::Tick(&this->super_AActor);
  obj = &(this->super_AActor).tracer;
  pAVar1 = GC::ReadBarrier<AActor>((AActor **)obj);
  if (pAVar1 != (AActor *)0x0) {
    pAVar1 = GC::ReadBarrier<AActor>((AActor **)obj);
    if (0 < pAVar1->health) {
      return;
    }
  }
  A_BossDeath(&this->super_AActor);
  (*(this->super_AActor).super_DThinker.super_DObject._vptr_DObject[4])(this);
  return;
}

Assistant:

void Tick()	// This function is needed for handling boss replacers
	{
		Super::Tick();
		if (tracer == NULL || tracer->health <= 0)
		{
			A_BossDeath(this);
			Destroy();
		}
	}